

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fp-impl.inc.c
# Opt level: O1

void gen_fsqrts(DisasContext_conflict10 *ctx)

{
  TCGContext_conflict10 *s;
  TCGTemp *ts;
  TCGTemp *ret;
  TCGTemp *local_48;
  TCGTemp *local_40;
  
  if (ctx->fpu_enabled != false) {
    s = ctx->uc->tcg_ctx;
    ts = tcg_temp_new_internal_ppc64(s,TCG_TYPE_I64,false);
    ret = tcg_temp_new_internal_ppc64(s,TCG_TYPE_I64,false);
    local_48 = (TCGTemp *)(s->cpu_env + (long)s);
    tcg_gen_callN_ppc64(s,helper_reset_fpstatus,(TCGTemp *)0x0,1,&local_48);
    tcg_gen_op3_ppc64(s,INDEX_op_ld_i64,(TCGArg)ts,(TCGArg)(s->cpu_env + (long)s),
                      (ulong)(ctx->opcode >> 7 & 0x1f0) + 0x12b28);
    local_48 = (TCGTemp *)(s->cpu_env + (long)s);
    local_40 = ts;
    tcg_gen_callN_ppc64(s,helper_fsqrt,ret,2,&local_48);
    local_48 = (TCGTemp *)(s->cpu_env + (long)s);
    local_40 = ret;
    tcg_gen_callN_ppc64(s,helper_frsp,ret,2,&local_48);
    tcg_gen_op3_ppc64(s,INDEX_op_st_i64,(TCGArg)ret,(TCGArg)(s->cpu_env + (long)s),
                      (ulong)(ctx->opcode >> 0x11 & 0x1f0) + 0x12b28);
    local_48 = (TCGTemp *)(s->cpu_env + (long)s);
    local_40 = ret;
    tcg_gen_callN_ppc64(s,helper_compute_fprf_float64,(TCGTemp *)0x0,2,&local_48);
    local_48 = (TCGTemp *)(s->cpu_env + (long)s);
    tcg_gen_callN_ppc64(s,helper_float_check_status,(TCGTemp *)0x0,1,&local_48);
    if ((ctx->opcode & 1) != 0) {
      gen_set_cr1_from_fpscr(ctx);
    }
    tcg_temp_free_internal_ppc64(s,ts);
    tcg_temp_free_internal_ppc64(s,ret);
    return;
  }
  gen_exception(ctx,7);
  return;
}

Assistant:

static void gen_fsqrts(DisasContext *ctx)
{
    TCGContext *tcg_ctx = ctx->uc->tcg_ctx;                                   \
    TCGv_i64 t0;
    TCGv_i64 t1;
    if (unlikely(!ctx->fpu_enabled)) {
        gen_exception(ctx, POWERPC_EXCP_FPU);
        return;
    }
    t0 = tcg_temp_new_i64(tcg_ctx);
    t1 = tcg_temp_new_i64(tcg_ctx);
    gen_reset_fpstatus(tcg_ctx);
    get_fpr(tcg_ctx, t0, rB(ctx->opcode));
    gen_helper_fsqrt(tcg_ctx, t1, tcg_ctx->cpu_env, t0);
    gen_helper_frsp(tcg_ctx, t1, tcg_ctx->cpu_env, t1);
    set_fpr(tcg_ctx, rD(ctx->opcode), t1);
    gen_compute_fprf_float64(tcg_ctx, t1);
    if (unlikely(Rc(ctx->opcode) != 0)) {
        gen_set_cr1_from_fpscr(ctx);
    }
    tcg_temp_free_i64(tcg_ctx, t0);
    tcg_temp_free_i64(tcg_ctx, t1);
}